

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

int ImportYUVAFromRGBA(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,uint8_t *a_ptr,int step,
                      int rgb_stride,float dithering,int use_iterative_conversion,
                      WebPPicture *picture)

{
  uint32_t uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint16_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  int row_has_alpha;
  int rows_have_alpha;
  VP8Random *rg;
  VP8Random base_rg;
  uint8_t *dst_a;
  uint8_t *dst_v;
  uint8_t *dst_u;
  uint8_t *dst_y;
  uint16_t *tmp_rgb;
  int use_dsp;
  int uv_width;
  int is_rgb;
  int has_alpha;
  int height;
  int width;
  int y;
  undefined8 in_stack_fffffffffffffe88;
  float dithering_00;
  int in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  uint8_t *in_stack_fffffffffffffe98;
  undefined1 *puVar10;
  uint8_t *in_stack_fffffffffffffea0;
  uint8_t *in_stack_fffffffffffffea8;
  uint16_t *in_stack_fffffffffffffeb0;
  VP8Random *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  WebPPicture *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  uint8_t *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  uint8_t *in_stack_fffffffffffffef8;
  uint8_t *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff10;
  WebPPicture *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint8_t *in_stack_ffffffffffffff80;
  uint8_t *in_stack_ffffffffffffff88;
  uint8_t *in_stack_ffffffffffffff90;
  uint8_t *local_68;
  uint8_t *local_60;
  int local_38;
  uint8_t *local_28;
  uint8_t *local_20;
  uint8_t *local_10;
  int local_4;
  
  uVar1 = rg->tab_[0];
  uVar2 = rg->tab_[1];
  uVar4 = CheckNonOpaque(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                         in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                         (int)in_stack_fffffffffffffe88);
  dithering_00 = (float)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  iVar5 = 0;
  if (uVar4 != 0) {
    iVar5 = 4;
  }
  rg->index2_ = iVar5;
  rg->index1_ = 0;
  if (((int)uVar1 < 4) || ((int)uVar2 < 4)) {
    row_has_alpha = 0;
  }
  iVar5 = WebPPictureAllocYUVA
                    (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
  if (iVar5 == 0) {
    local_4 = 0;
  }
  else {
    if (row_has_alpha == 0) {
      iVar5 = (int)(uVar1 + 1) >> 1;
      puVar7 = (uint16_t *)
               WebPSafeMalloc((uint64_t)in_stack_fffffffffffffe98,
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      local_60 = *(uint8_t **)(rg->tab_ + 2);
      local_68 = *(uint8_t **)(rg->tab_ + 4);
      puVar9 = *(uint8_t **)(rg->tab_ + 6);
      puVar8 = *(uint8_t **)(rg->tab_ + 10);
      puVar10 = (undefined1 *)0x0;
      bVar3 = 0.0 < in_XMM0_Da;
      if (bVar3) {
        VP8InitRandom((VP8Random *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      dithering_00);
        puVar10 = &stack0xfffffffffffffea0;
      }
      WebPInitConvertARGBToYUV();
      InitGammaTables();
      if (puVar7 == (uint16_t *)0x0) {
        return 0;
      }
      local_28 = in_RCX;
      local_20 = in_RDX;
      local_10 = in_RDI;
      for (local_38 = 0; iVar6 = (int)((ulong)puVar10 >> 0x20), local_38 < (int)uVar2 >> 1;
          local_38 = local_38 + 1) {
        in_stack_fffffffffffffe94 = uVar4;
        if (bVar3 || in_R8D != 3) {
          ConvertRowToY((uint8_t *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                        in_stack_fffffffffffffea0,iVar6,
                        (uint8_t *)CONCAT44(uVar4,in_stack_fffffffffffffe90),iVar6,
                        in_stack_fffffffffffffec0);
          iVar6 = (int)((ulong)puVar10 >> 0x20);
          ConvertRowToY((uint8_t *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                        in_stack_fffffffffffffea0,iVar6,
                        (uint8_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        iVar6,in_stack_fffffffffffffec0);
        }
        else if (in_RDI < in_RDX) {
          (*WebPConvertRGB24ToY)(local_10,local_60,uVar1);
          (*WebPConvertRGB24ToY)(local_10 + in_R9D,local_60 + (int)rg->tab_[8],uVar1);
        }
        else {
          (*WebPConvertBGR24ToY)(local_20,local_60,uVar1);
          (*WebPConvertBGR24ToY)(local_20 + in_R9D,local_60 + (int)rg->tab_[8],uVar1);
        }
        local_60 = local_60 + (int)(rg->tab_[8] << 1);
        if (uVar4 != 0) {
          iVar6 = (*WebPExtractAlpha)(local_28,in_R9D,uVar1,2,puVar8,rg->tab_[0xc]);
          in_stack_fffffffffffffe94 = ((iVar6 != 0 ^ 0xffU) & 1) & in_stack_fffffffffffffe94;
          puVar8 = puVar8 + (int)(rg->tab_[0xc] << 1);
        }
        if (in_stack_fffffffffffffe94 == 0) {
          AccumulateRGB((uint8_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (uint8_t *)in_stack_fffffffffffffed8,
                        (uint8_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
                        (uint16_t *)in_stack_fffffffffffffec0,in_stack_fffffffffffffef0);
        }
        else {
          AccumulateRGBA(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                         (uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                         (uint16_t *)in_stack_fffffffffffffed8,in_stack_ffffffffffffff10);
        }
        if (puVar10 == (undefined1 *)0x0) {
          (*WebPConvertRGBA32ToUV)(puVar7,local_68,puVar9,iVar5);
        }
        else {
          ConvertRowsToUV(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                          in_stack_fffffffffffffea0,(int)((ulong)puVar10 >> 0x20),
                          (VP8Random *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                         );
        }
        local_68 = local_68 + (int)rg->tab_[9];
        puVar9 = puVar9 + (int)rg->tab_[9];
        local_10 = local_10 + (in_R9D << 1);
        local_20 = local_20 + (in_R9D << 1);
        if (uVar4 != 0) {
          local_28 = local_28 + (in_R9D << 1);
        }
      }
      if ((uVar2 & 1) != 0) {
        if (bVar3 || in_R8D != 3) {
          ConvertRowToY((uint8_t *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                        in_stack_fffffffffffffea0,iVar6,
                        (uint8_t *)CONCAT44(in_stack_fffffffffffffe94,uVar4),iVar6,
                        in_stack_fffffffffffffec0);
        }
        else if (local_10 < local_20) {
          (*WebPConvertRGB24ToY)(local_10,local_60,uVar1);
        }
        else {
          (*WebPConvertBGR24ToY)(local_20,local_60,uVar1);
        }
        if (uVar4 != 0) {
          iVar6 = (*WebPExtractAlpha)(local_28,0,uVar1,1,puVar8,0);
          uVar4 = ((iVar6 != 0 ^ 0xffU) & 1) & uVar4;
        }
        if (uVar4 == 0) {
          AccumulateRGB((uint8_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (uint8_t *)in_stack_fffffffffffffed8,
                        (uint8_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
                        (uint16_t *)in_stack_fffffffffffffec0,in_stack_fffffffffffffef0);
        }
        else {
          AccumulateRGBA(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                         (uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                         (uint16_t *)in_stack_fffffffffffffed8,in_stack_ffffffffffffff10);
        }
        if (puVar10 == (undefined1 *)0x0) {
          (*WebPConvertRGBA32ToUV)(puVar7,local_68,puVar9,iVar5);
        }
        else {
          ConvertRowsToUV(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                          in_stack_fffffffffffffea0,(int)((ulong)puVar10 >> 0x20),
                          (VP8Random *)CONCAT44(in_stack_fffffffffffffe94,uVar4));
        }
      }
      WebPSafeFree((void *)0x10bb7b);
    }
    else {
      InitGammaTablesS();
      iVar5 = PreprocessARGB(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                             in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if (iVar5 == 0) {
        return 0;
      }
      if (uVar4 != 0) {
        (*WebPExtractAlpha)(in_RCX,in_R9D,uVar1,uVar2,*(uint8_t **)(rg->tab_ + 10),rg->tab_[0xc]);
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int ImportYUVAFromRGBA(const uint8_t* r_ptr,
                              const uint8_t* g_ptr,
                              const uint8_t* b_ptr,
                              const uint8_t* a_ptr,
                              int step,         // bytes per pixel
                              int rgb_stride,   // bytes per scanline
                              float dithering,
                              int use_iterative_conversion,
                              WebPPicture* const picture) {
  int y;
  const int width = picture->width;
  const int height = picture->height;
  const int has_alpha = CheckNonOpaque(a_ptr, width, height, step, rgb_stride);
  const int is_rgb = (r_ptr < b_ptr);  // otherwise it's bgr

  picture->colorspace = has_alpha ? WEBP_YUV420A : WEBP_YUV420;
  picture->use_argb = 0;

  // disable smart conversion if source is too small (overkill).
  if (width < kMinDimensionIterativeConversion ||
      height < kMinDimensionIterativeConversion) {
    use_iterative_conversion = 0;
  }

  if (!WebPPictureAllocYUVA(picture, width, height)) {
    return 0;
  }
  if (has_alpha) {
    assert(step == 4);
#if defined(USE_GAMMA_COMPRESSION) && defined(USE_INVERSE_ALPHA_TABLE)
    assert(kAlphaFix + kGammaFix <= 31);
#endif
  }

  if (use_iterative_conversion) {
    InitGammaTablesS();
    if (!PreprocessARGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, picture)) {
      return 0;
    }
    if (has_alpha) {
      WebPExtractAlpha(a_ptr, rgb_stride, width, height,
                       picture->a, picture->a_stride);
    }
  } else {
    const int uv_width = (width + 1) >> 1;
    int use_dsp = (step == 3);  // use special function in this case
    // temporary storage for accumulated R/G/B values during conversion to U/V
    uint16_t* const tmp_rgb =
        (uint16_t*)WebPSafeMalloc(4 * uv_width, sizeof(*tmp_rgb));
    uint8_t* dst_y = picture->y;
    uint8_t* dst_u = picture->u;
    uint8_t* dst_v = picture->v;
    uint8_t* dst_a = picture->a;

    VP8Random base_rg;
    VP8Random* rg = NULL;
    if (dithering > 0.) {
      VP8InitRandom(&base_rg, dithering);
      rg = &base_rg;
      use_dsp = 0;   // can't use dsp in this case
    }
    WebPInitConvertARGBToYUV();
    InitGammaTables();

    if (tmp_rgb == NULL) return 0;  // malloc error

    // Downsample Y/U/V planes, two rows at a time
    for (y = 0; y < (height >> 1); ++y) {
      int rows_have_alpha = has_alpha;
      if (use_dsp) {
        if (is_rgb) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
          WebPConvertRGB24ToY(r_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
          WebPConvertBGR24ToY(b_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
        ConvertRowToY(r_ptr + rgb_stride,
                      g_ptr + rgb_stride,
                      b_ptr + rgb_stride, step,
                      dst_y + picture->y_stride, width, rg);
      }
      dst_y += 2 * picture->y_stride;
      if (has_alpha) {
        rows_have_alpha &= !WebPExtractAlpha(a_ptr, rgb_stride, width, 2,
                                             dst_a, picture->a_stride);
        dst_a += 2 * picture->a_stride;
      }
      // Collect averaged R/G/B(/A)
      if (!rows_have_alpha) {
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, rgb_stride, tmp_rgb, width);
      }
      // Convert to U/V
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
      dst_u += picture->uv_stride;
      dst_v += picture->uv_stride;
      r_ptr += 2 * rgb_stride;
      b_ptr += 2 * rgb_stride;
      g_ptr += 2 * rgb_stride;
      if (has_alpha) a_ptr += 2 * rgb_stride;
    }
    if (height & 1) {    // extra last row
      int row_has_alpha = has_alpha;
      if (use_dsp) {
        if (r_ptr < b_ptr) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
      }
      if (row_has_alpha) {
        row_has_alpha &= !WebPExtractAlpha(a_ptr, 0, width, 1, dst_a, 0);
      }
      // Collect averaged R/G/B(/A)
      if (!row_has_alpha) {
        // Collect averaged R/G/B
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, /* rgb_stride = */ 0,
                      tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, /* rgb_stride = */ 0,
                       tmp_rgb, width);
      }
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
    }
    WebPSafeFree(tmp_rgb);
  }
  return 1;
}